

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkDeviceAddress __thiscall
VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
          (VulkanLogicalDevice *this,VkAccelerationStructureKHR AS)

{
  VkDeviceAddress VVar1;
  undefined1 local_30 [8];
  VkAccelerationStructureDeviceAddressInfoKHR Info;
  VkAccelerationStructureKHR AS_local;
  VulkanLogicalDevice *this_local;
  
  Info.accelerationStructure = AS;
  memset(local_30,0,0x18);
  local_30._0_4_ = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_DEVICE_ADDRESS_INFO_KHR;
  Info.pNext = Info.accelerationStructure;
  VVar1 = (*vkGetAccelerationStructureDeviceAddressKHR)
                    (this->m_VkDevice,(VkAccelerationStructureDeviceAddressInfoKHR *)local_30);
  return VVar1;
}

Assistant:

VkDeviceAddress VulkanLogicalDevice::GetAccelerationStructureDeviceAddress(VkAccelerationStructureKHR AS) const
{
#if DILIGENT_USE_VOLK
    VkAccelerationStructureDeviceAddressInfoKHR Info = {};

    Info.sType                 = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_DEVICE_ADDRESS_INFO_KHR;
    Info.accelerationStructure = AS;

    return vkGetAccelerationStructureDeviceAddressKHR(m_VkDevice, &Info);
#else
    UNSUPPORTED("vkGetAccelerationStructureDeviceAddressKHR is only available through Volk");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}